

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O0

CScript * BuildScript<CScript,CScript&,opcodetype>
                    (CScript *inputs,CScript *inputs_1,opcodetype *inputs_2)

{
  long lVar1;
  anon_class_16_2_441f04d1 *in_RDI;
  long in_FS_OFFSET;
  CScript *ret;
  int cnt;
  CScript *in_stack_ffffffffffffff68;
  opcodetype *in_stack_ffffffffffffff70;
  CScript *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  CScript::CScript(in_stack_ffffffffffffff68);
  BuildScript<CScript,_CScript_&,_opcodetype>::anon_class_16_2_441f04d1::operator()
            ((anon_class_16_2_441f04d1 *)CONCAT17(uVar2,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff90);
  BuildScript<CScript,_CScript_&,_opcodetype>::anon_class_16_2_441f04d1::operator()
            ((anon_class_16_2_441f04d1 *)CONCAT17(uVar2,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff90);
  BuildScript<CScript,_CScript_&,_opcodetype>::anon_class_16_2_441f04d1::operator()
            (in_RDI,in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (CScript *)in_RDI;
}

Assistant:

CScript BuildScript(Ts&&... inputs)
{
    CScript ret;
    int cnt{0};

    ([&ret, &cnt] (Ts&& input) {
        if constexpr (std::is_same_v<std::remove_cv_t<std::remove_reference_t<Ts>>, CScript>) {
            // If it is a CScript, extend ret with it. Move or copy the first element instead.
            if (cnt == 0) {
                ret = std::forward<Ts>(input);
            } else {
                ret.insert(ret.end(), input.begin(), input.end());
            }
        } else {
            // Otherwise invoke CScript::operator<<.
            ret << input;
        }
        cnt++;
    } (std::forward<Ts>(inputs)), ...);

    return ret;
}